

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  cpp *this_00;
  mapped_type *pmVar2;
  undefined1 qualified;
  int extraout_EDX;
  int extraout_EDX_00;
  int i;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sub_vars;
  key_type local_b0;
  string local_90;
  Printer *local_70;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  ServiceGenerator *local_38;
  
  pcVar3 = "const ::google::protobuf::Message& $classname$::GetResponsePrototype(\n";
  if (which == REQUEST) {
    pcVar3 = "const ::google::protobuf::Message& $classname$::GetRequestPrototype(\n";
  }
  io::Printer::Print(printer,&this->vars_,pcVar3);
  local_70 = printer;
  io::Printer::Print(printer,&this->vars_,
                     "    const ::google::protobuf::MethodDescriptor* method) const {\n  GOOGLE_DCHECK_EQ(method->service(), descriptor());\n  switch(method->index()) {\n"
                    );
  pSVar1 = this->descriptor_;
  local_38 = this;
  if (0 < *(int *)(pSVar1 + 0x20)) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (which == REQUEST) {
        this_00 = (cpp *)MethodDescriptor::input_type
                                   ((MethodDescriptor *)(*(long *)(pSVar1 + 0x28) + lVar5));
        i = extraout_EDX_00;
      }
      else {
        this_00 = (cpp *)MethodDescriptor::output_type
                                   ((MethodDescriptor *)(*(long *)(pSVar1 + 0x28) + lVar5));
        i = extraout_EDX;
      }
      local_68._8_4_ = _S_red;
      qualified = 0;
      local_68._16_8_ = (_Base_ptr)0x0;
      local_68._24_8_ = local_68 + 8;
      local_40 = 0;
      local_48 = (_Base_ptr)local_68._24_8_;
      SimpleItoa_abi_cxx11_(&local_90,(protobuf *)(uVar4 & 0xffffffff),i);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"index","");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_68,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      ClassName_abi_cxx11_(&local_90,this_00,(Descriptor *)0x1,(bool)qualified);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"type","");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_68,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(local_70,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,
                         "    case $index$:\n      return $type$::default_instance();\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_68);
      uVar4 = uVar4 + 1;
      pSVar1 = local_38->descriptor_;
      lVar5 = lVar5 + 0x68;
    } while ((long)uVar4 < (long)*(int *)(pSVar1 + 0x20));
  }
  pcVar3 = "output";
  if (which == REQUEST) {
    pcVar3 = "input";
  }
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,pcVar3,pcVar3 + (6 - (ulong)(which == REQUEST)));
  io::Printer::Print(local_70,
                     "    default:\n      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n      return *::google::protobuf::MessageFactory::generated_factory()\n          ->GetPrototype(method->$input_or_output$_type());\n  }\n}\n\n"
                     ,"input_or_output",(string *)local_68);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  if (which == REQUEST) {
    printer->Print(vars_,
      "const ::google::protobuf::Message& $classname$::GetRequestPrototype(\n");
  } else {
    printer->Print(vars_,
      "const ::google::protobuf::Message& $classname$::GetResponsePrototype(\n");
  }

  printer->Print(vars_,
    "    const ::google::protobuf::MethodDescriptor* method) const {\n"
    "  GOOGLE_DCHECK_EQ(method->service(), descriptor());\n"
    "  switch(method->index()) {\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    const Descriptor* type =
      (which == REQUEST) ? method->input_type() : method->output_type();

    std::map<string, string> sub_vars;
    sub_vars["index"] = SimpleItoa(i);
    sub_vars["type"] = ClassName(type, true);

    printer->Print(sub_vars,
      "    case $index$:\n"
      "      return $type$::default_instance();\n");
  }

  printer->Print(
    "    default:\n"
    "      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n"
    "      return *::google::protobuf::MessageFactory::generated_factory()\n"
    "          ->GetPrototype(method->$input_or_output$_type());\n"
    "  }\n"
    "}\n"
    "\n",
    "input_or_output", which == REQUEST ? "input" : "output");
}